

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

cf_void_t cf_thread_exit(cf_uint32_t code)

{
  pthread_exit((void *)(ulong)code);
}

Assistant:

cf_void_t cf_thread_exit(cf_uint32_t code) {
#ifdef CF_OS_WIN
    ExitThread(code);
#else
    /* 为了和windows保持一致 */
    pthread_exit((cf_void_t*)(cf_uintptr_t)code);
#endif
}